

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_visuals.cxx
# Opt level: O2

void __thiscall xray_re::xr_scene_visuals::load(xr_scene_visuals *this,xr_reader *r)

{
  uint32_t *puVar1;
  size_t sVar2;
  uint16_t version;
  
  version = 0;
  xr_reader::r_chunk<unsigned_short>(r,0x1001,&version);
  if (version == 0) {
    xr_scene_objects::load(&this->super_xr_scene_objects,r);
    xr_reader::r_chunk<unsigned_int>(r,0x1003,&this->m_flags);
    sVar2 = xr_reader::find_chunk(r,0x1002);
    if (sVar2 != 0) {
      xr_reader::r_fvector3(r,&this->m_min_scale);
      xr_reader::r_fvector3(r,&this->m_max_scale);
      xr_reader::r_fvector3(r,&this->m_min_rotate);
      xr_reader::r_fvector3(r,&this->m_max_rotate);
      puVar1 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
      xr_reader::
      r_seq<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,xray_re::xr_reader::f_r_sz>
                (r,*puVar1,&this->m_snap_objects);
    }
    return;
  }
  __assert_fail("version == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_visuals.cxx"
                ,0x50,"virtual void xray_re::xr_scene_visuals::load(xr_reader &)");
}

Assistant:

void xr_scene_visuals::load(xr_reader& r)
{
	uint16_t version = 0;
	r.r_chunk<uint16_t>(TOOLS_CHUNK_VERSION, version);
	xr_assert(version == 0);
	xr_scene_objects::load(r);
	r.r_chunk<uint32_t>(SCENEOBJS_CHUNK_COMMON_FLAGS, m_flags);
	if (r.find_chunk(SCENEOBJS_CHUNK_COMMON_PARAMS)) {
		r.r_fvector3(m_min_scale);
		r.r_fvector3(m_max_scale);
		r.r_fvector3(m_min_rotate);
		r.r_fvector3(m_max_rotate);
		r.r_seq(r.r_u32(), m_snap_objects, xr_reader::f_r_sz());
	}
}